

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O2

void VP8LPutBitsFlushBits(VP8LBitWriter *bw)

{
  ulong uVar1;
  int iVar2;
  uint8_t *puVar3;
  
  puVar3 = bw->cur;
  if (bw->end < puVar3 + 4) {
    iVar2 = VP8LBitWriterResize(bw,(size_t)(bw->end + (0x8000 - (long)bw->buf)));
    if (iVar2 == 0) {
      bw->cur = bw->buf;
      bw->error = 1;
      return;
    }
    puVar3 = bw->cur;
  }
  uVar1 = bw->bits;
  *(int *)puVar3 = (int)uVar1;
  bw->cur = puVar3 + 4;
  bw->bits = uVar1 >> 0x20;
  bw->used = bw->used + -0x20;
  return;
}

Assistant:

void VP8LPutBitsFlushBits(VP8LBitWriter* const bw) {
  // If needed, make some room by flushing some bits out.
  if (bw->cur + VP8L_WRITER_BYTES > bw->end) {
    const uint64_t extra_size = (bw->end - bw->buf) + MIN_EXTRA_SIZE;
    if (!CheckSizeOverflow(extra_size) ||
        !VP8LBitWriterResize(bw, (size_t)extra_size)) {
      bw->cur = bw->buf;
      bw->error = 1;
      return;
    }
  }
  *(vp8l_wtype_t*)bw->cur = (vp8l_wtype_t)WSWAP((vp8l_wtype_t)bw->bits);
  bw->cur += VP8L_WRITER_BYTES;
  bw->bits >>= VP8L_WRITER_BITS;
  bw->used -= VP8L_WRITER_BITS;
}